

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O1

void __thiscall
glcts::GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates
          (GPUShader5TextureGatherOffsetTestBase *this)

{
  pointer *ppVVar1;
  bool bVar2;
  pointer pfVar3;
  iterator __position;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint i;
  int iVar8;
  uint uVar9;
  VertexBufferInfo info;
  VertexBufferInfo local_40;
  
  uVar9 = this->m_is_texture_array | 2;
  this->m_n_coordinates_components = uVar9;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->m_coordinates_buffer_data,(ulong)(uVar9 << 7));
  bVar2 = this->m_is_texture_array;
  pfVar3 = (this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar3[0] = 0.0;
  pfVar3[1] = 0.0;
  if (bVar2 == true) {
    pfVar3[2] = 0.0;
    uVar9 = this->m_n_coordinates_components;
    uVar7 = (ulong)uVar9;
    pfVar3[uVar7] = 0.0;
    pfVar3[uVar9 + 1] = 1.0;
    pfVar3[uVar9 + 2] = 1.0;
    pfVar3[uVar9 * 2] = 1.0;
    pfVar3[(ulong)(uVar9 * 2) + 1] = 0.0;
    pfVar3[uVar9 * 2 + 2] = 2.0;
    pfVar3[uVar9 * 3] = 1.0;
    pfVar3[uVar7 * 3 + 1 & 0xffffffff] = 1.0;
    pfVar3[uVar7 * 3 + 2 & 0xffffffff] = 3.0;
    iVar8 = 4;
    do {
      iVar4 = rand();
      iVar5 = rand();
      uVar9 = rand();
      uVar6 = this->m_n_coordinates_components * iVar8;
      pfVar3 = (this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar3[uVar6] = (float)(iVar4 % 0x4000) * 0.0009765625 + -8.0;
      pfVar3[uVar6 + 1] = (float)(iVar5 % 0x4000) * 0.0009765625 + -8.0;
      pfVar3[uVar6 + 2] = (float)((uVar9 & 3) << 10) * 0.0009765625;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x80);
  }
  else {
    uVar9 = this->m_n_coordinates_components;
    pfVar3[uVar9] = 0.0;
    pfVar3[uVar9 + 1] = 1.0;
    pfVar3[uVar9 * 2] = 1.0;
    pfVar3[(ulong)(uVar9 * 2) + 1] = 0.0;
    pfVar3[uVar9 * 3] = 1.0;
    pfVar3[(ulong)uVar9 * 3 + 1 & 0xffffffff] = 1.0;
    iVar8 = 4;
    do {
      iVar4 = rand();
      iVar5 = rand();
      uVar9 = this->m_n_coordinates_components * iVar8;
      pfVar3 = (this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pfVar3[uVar9] = (float)(iVar4 % 0x4000) * 0.0009765625 + -8.0;
      pfVar3[uVar9 + 1] = (float)(iVar5 % 0x4000) * 0.0009765625 + -8.0;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x80);
  }
  local_40.attribute_name = "texCoords";
  local_40.n_components = this->m_n_coordinates_components;
  local_40.type = 0x1406;
  local_40.data =
       (this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar9 = *(int *)&(this->m_coordinates_buffer_data).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish - (int)local_40.data;
  local_40.data_size = uVar9 & 0xfffffffc;
  __position._M_current =
       (this->m_vertex_buffer_infos).
       super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vertex_buffer_infos).
      super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
    ::_M_realloc_insert<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo_const&>
              ((vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>>
                *)&this->m_vertex_buffer_infos,__position,&local_40);
  }
  else {
    (__position._M_current)->data = local_40.data;
    *(ulong *)&(__position._M_current)->data_size =
         CONCAT44(local_40._28_4_,uVar9) & 0xfffffffffffffffc;
    (__position._M_current)->attribute_name = "texCoords";
    (__position._M_current)->n_components = local_40.n_components;
    (__position._M_current)->type = 0x1406;
    ppVVar1 = &(this->m_vertex_buffer_infos).
               super__Vector_base<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates()
{
	/* Select proper number of components */
	if (true == m_is_texture_array)
	{
		m_n_coordinates_components = 3;
	}
	else
	{
		m_n_coordinates_components = 2;
	}

	/* Prepare storage for texture coordinates */
	m_coordinates_buffer_data.resize(m_n_vertices * m_n_coordinates_components);

	/* Variables for calculation of texture coordiantes' range and offsets */
	const float coordinate_denominator = m_coordinate_resolution;
	int			x_modulus;
	float		x_offset;
	float		x_range;
	int			y_modulus;
	float		y_offset;
	float		y_range;

	/* Calculation of texture coordiantes' range and offsets */
	x_range = m_max_coordinate_value - m_min_coordinate_value;
	y_range = m_max_coordinate_value - m_min_coordinate_value;

	x_offset = m_min_coordinate_value;
	y_offset = m_min_coordinate_value;

	x_range *= coordinate_denominator;
	y_range *= coordinate_denominator;

	x_modulus = (int)x_range;
	y_modulus = (int)y_range;

	/* Prepare texture coordinates */
	if (true == m_is_texture_array)
	{
		/* First four coordinates are corners, each comes from unique level */
		setCoordinatesData(0.0f, 0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;
			const glw::GLfloat coord_z =
				((float)(rand() % m_n_texture_array_length * m_coordinate_resolution)) / coordinate_denominator;

			setCoordinatesData(coord_x, coord_y, coord_z, i);
		}
	}
	else
	{
		/* First four coordinates are corners */
		setCoordinatesData(0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;

			setCoordinatesData(coord_x, coord_y, i);
		}
	}

	/* Setup coordinates VB info */
	VertexBufferInfo info;

	info.attribute_name = m_coordinates_attribute_name;
	info.n_components   = m_n_coordinates_components;
	info.type			= GL_FLOAT;
	info.data			= &m_coordinates_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_coordinates_buffer_data.size() * sizeof(glw::GLfloat));

	/* Store results */
	m_vertex_buffer_infos.push_back(info);
}